

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

void __thiscall
Wasm::WasmModuleGenerator::GenerateFunctionHeader(WasmModuleGenerator *this,uint32 index)

{
  undefined1 *puVar1;
  uint uVar2;
  WasmSignature *pWVar3;
  code *pcVar4;
  ulong size;
  undefined8 this_00;
  bool bVar5;
  AsmJsVarType type;
  ArgSlot AVar6;
  ushort uVar7;
  BOOL BVar8;
  Type displayNameLength;
  Type TVar9;
  int iVar10;
  Local wasmType;
  WasmType wasmType_00;
  AsmJsRetType AVar11;
  WasmFunctionInfo *this_01;
  Recycler *pRVar12;
  undefined4 *puVar13;
  char16_t *displayName;
  FunctionBody *this_02;
  WasmReaderInfo *addr;
  AsmJsFunctionInfo *this_03;
  uint *puVar14;
  Which *pWVar15;
  WasmExport *pWVar16;
  WasmCompilationException *this_04;
  uint32 iExport;
  WebAssemblyModule *pWVar17;
  ulong uVar18;
  size_t sizeInWords;
  size_t size_00;
  undefined1 local_78 [8];
  TrackAllocData data;
  
  this_01 = Js::WebAssemblyModule::GetWasmFunctionInfo(this->m_module,index);
  if (this_01 == (WasmFunctionInfo *)0x0) {
    this_04 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_04,L"Invalid function index %u",(ulong)index);
  }
  else {
    displayNameLength = this_01->m_nameLength;
    if (displayNameLength == 0) {
      pWVar17 = this->m_module;
      if (pWVar17->m_exportCount == 0) {
        displayNameLength = 0;
        displayName = (char16_t *)0x0;
      }
      else {
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        displayName = (char16_t *)0x0;
        displayNameLength = 0;
        iExport = 0;
        do {
          pWVar16 = Js::WebAssemblyModule::GetExport(pWVar17,iExport);
          bVar5 = true;
          if ((((pWVar16 != (WasmExport *)0x0) && (pWVar16->kind == Function)) &&
              (pWVar16->nameLength != 0)) &&
             ((TVar9 = Js::WebAssemblyModule::GetFunctionIndexType(this->m_module,pWVar16->index),
              TVar9 == Function && (pWVar16->index == this_01->m_number)))) {
            iVar10 = pWVar16->nameLength + 0x10;
            sizeInWords = (size_t)iVar10;
            local_78 = (undefined1  [8])&char16_t::typeinfo;
            data.typeinfo = (type_info *)0x0;
            data.count = (size_t)anon_var_dwarf_afe8bb2;
            data.filename._0_4_ = 0x187;
            data.plusSize = sizeInWords;
            pRVar12 = Memory::Recycler::TrackAllocInfo(this->m_recycler,(TrackAllocData *)local_78);
            if (iVar10 == 0) {
              Memory::Recycler::ClearTrackAllocInfo(pRVar12,(TrackAllocData *)0x0);
              displayName = (char16_t *)&DAT_00000008;
            }
            else {
              size_00 = sizeInWords * 2;
              if (iVar10 < 0) {
                size_00 = 0xffffffffffffffff;
              }
              data._32_8_ = pRVar12;
              BVar8 = ExceptionCheck::CanHandleOutOfMemory();
              if (BVar8 == 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar13 = 1;
                bVar5 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                   ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                   "ExceptionCheck::CanHandleOutOfMemory()");
                if (!bVar5) goto LAB_00f2f6e6;
                *puVar13 = 0;
              }
              displayName = (char16_t *)
                            Memory::Recycler::
                            AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                                      ((Recycler *)data._32_8_,size_00);
              if (displayName == (char16_t *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar13 = 1;
                bVar5 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                   ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
                if (!bVar5) goto LAB_00f2f6e6;
                *puVar13 = 0;
              }
            }
            bVar5 = false;
            displayNameLength =
                 swprintf_s((char16_t_conflict *)displayName,sizeInWords,
                            (char16_t_conflict *)L"%s[%u]");
          }
          if (!bVar5) break;
          iExport = iExport + 1;
          pWVar17 = this->m_module;
        } while (iExport < pWVar17->m_exportCount);
      }
    }
    else {
      displayName = (this_01->m_name).ptr;
    }
    if (displayName == (char16_t *)0x0) {
      local_78 = (undefined1  [8])&char16_t::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0x20;
      data.count = (size_t)anon_var_dwarf_afe8bb2;
      data.filename._0_4_ = 0x191;
      pRVar12 = Memory::Recycler::TrackAllocInfo(this->m_recycler,(TrackAllocData *)local_78);
      BVar8 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar8 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar5) goto LAB_00f2f6e6;
        *puVar13 = 0;
      }
      displayName = (char16_t *)
                    Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                              (pRVar12,0x40);
      if (displayName == (char16 *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar5) goto LAB_00f2f6e6;
        *puVar13 = 0;
      }
      displayNameLength =
           swprintf_s((char16_t_conflict *)displayName,0x20,
                      (char16_t_conflict *)L"wasm-function[%u]");
    }
    this_02 = Js::FunctionBody::NewFromRecycler
                        (this->m_scriptContext,displayName,displayNameLength,0,0,this->m_sourceInfo,
                         ((((this->m_sourceInfo->m_srcInfo).ptr)->sourceContextInfo).ptr)->
                         sourceContextId,this_01->m_number,ErrorOnNew,Flags_None);
    Memory::Recycler::WBSetBit((char *)&this_01->m_body);
    (this_01->m_body).ptr = this_02;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this_01->m_body);
    Js::ParseableFunctionInfo::SetSourceInfo(&this_02->super_ParseableFunctionInfo,0);
    Js::FunctionBody::AllocateAsmJsFunctionInfo(this_02);
    puVar1 = &(this_02->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47;
    *puVar1 = *puVar1 | 0x40;
    puVar1 = &(this_02->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46;
    *puVar1 = *puVar1 | 0xe;
    local_78 = (undefined1  [8])&WasmReaderInfo::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_afe8bb2;
    data.filename._0_4_ = 0x1ad;
    pRVar12 = Memory::Recycler::TrackAllocInfo(this->m_recycler,(TrackAllocData *)local_78);
    addr = (WasmReaderInfo *)new<Memory::Recycler>(0x10,pRVar12,0x38bbb2);
    (addr->m_funcInfo).ptr = (WasmFunctionInfo *)0x0;
    (addr->m_module).ptr = (WebAssemblyModule *)0x0;
    Memory::Recycler::WBSetBit((char *)addr);
    (addr->m_funcInfo).ptr = this_01;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    pWVar17 = this->m_module;
    Memory::Recycler::WBSetBit((char *)&addr->m_module);
    (addr->m_module).ptr = pWVar17;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&addr->m_module);
    Js::WasmLibrary::ResetFunctionBodyDefaultEntryPoint(this_02);
    data._32_8_ = this_02;
    this_03 = (AsmJsFunctionInfo *)
              Js::FunctionProxy::GetAuxPtr((FunctionProxy *)this_02,AsmJsFunctionInfo);
    Memory::Recycler::WBSetBit((char *)&this_03->mWasmReaderInfo);
    (this_03->mWasmReaderInfo).ptr = addr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this_03->mWasmReaderInfo);
    pWVar17 = this->m_module;
    Memory::Recycler::WBSetBit((char *)&this_03->mWasmModule);
    (this_03->mWasmModule).ptr = pWVar17;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this_03->mWasmModule);
    AVar6 = WasmFunctionInfo::GetParamCount(this_01);
    this_03->mArgCount = AVar6;
    pWVar3 = (this_01->m_signature).ptr;
    Memory::Recycler::WBSetBit((char *)&this_03->mSignature);
    (this_03->mSignature).ptr = pWVar3;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this_03->mSignature);
    uVar7 = 3;
    if (3 < AVar6) {
      uVar7 = AVar6;
    }
    this_03->mArgSizesLength = uVar7;
    data.plusSize = (size_t)uVar7;
    local_78 = (undefined1  [8])&unsigned_int::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_afe8bb2;
    data.filename._0_4_ = 0x1bc;
    pRVar12 = Memory::Recycler::TrackAllocInfo(this->m_recycler,(TrackAllocData *)local_78);
    BVar8 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar8 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar5) goto LAB_00f2f6e6;
      *puVar13 = 0;
    }
    puVar14 = (uint *)Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                                (pRVar12,(ulong)uVar7 << 2);
    if (puVar14 == (uint *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar5) goto LAB_00f2f6e6;
      *puVar13 = 0;
    }
    Memory::Recycler::WBSetBit((char *)&this_03->mArgSizes);
    (this_03->mArgSizes).ptr = puVar14;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this_03->mArgSizes);
    this_00 = data._32_8_;
    size = (ulong)AVar6;
    if (AVar6 == 0) {
      *(byte *)(data._32_8_ + 0x47) = *(byte *)(data._32_8_ + 0x47) & 0xfb;
    }
    else {
      Js::ParseableFunctionInfo::SetInParamsCount((ParseableFunctionInfo *)data._32_8_,AVar6 + 1);
      Js::ParseableFunctionInfo::SetReportedInParamsCount
                ((ParseableFunctionInfo *)this_00,AVar6 + 1);
      local_78 = (undefined1  [8])&Js::AsmJsVarType::Which::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_afe8bb2;
      data.filename._0_4_ = 0x1c4;
      data.plusSize = size;
      pRVar12 = Memory::Recycler::TrackAllocInfo(this->m_recycler,(TrackAllocData *)local_78);
      BVar8 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar8 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar5) goto LAB_00f2f6e6;
        *puVar13 = 0;
      }
      pWVar15 = (Which *)Memory::Recycler::
                         AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>(pRVar12,size);
      if (pWVar15 == (Which *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar5) {
LAB_00f2f6e6:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar13 = 0;
      }
      Memory::Recycler::WBSetBit((char *)&this_03->mArgType);
      (this_03->mArgType).ptr = pWVar15;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&this_03->mArgType);
    }
    if (AVar6 != 0) {
      uVar18 = 0;
      do {
        AVar6 = (ArgSlot)uVar18;
        wasmType = WasmSignature::GetParam((this_01->m_signature).ptr,AVar6);
        type = WasmToAsmJs::GetAsmJsVarType(wasmType);
        Js::AsmJsFunctionInfo::SetArgType(this_03,type,AVar6);
        AVar6 = WasmSignature::GetParamSize((this_01->m_signature).ptr,AVar6);
        puVar14[uVar18] = (uint)AVar6;
        uVar18 = uVar18 + 1;
      } while (size != uVar18);
    }
    AVar6 = WasmSignature::GetParamsSize((this_01->m_signature).ptr);
    this_03->mArgByteSize = AVar6;
    pWVar3 = (this_01->m_signature).ptr;
    uVar2 = pWVar3->m_resultsCount;
    if (uVar2 < 2) {
      wasmType_00 = Void;
      if (uVar2 == 1) {
        wasmType_00 = WasmSignature::GetResult(pWVar3,0);
      }
      AVar11 = WasmToAsmJs::GetAsmJsReturnType(wasmType_00);
      (this_03->mReturnType).which_ = AVar11.which_;
      return;
    }
    this_04 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException(this_04,L"Multi return values not supported")
    ;
  }
  __cxa_throw(this_04,&WasmCompilationException::typeinfo,
              WasmCompilationException::~WasmCompilationException);
}

Assistant:

void WasmModuleGenerator::GenerateFunctionHeader(uint32 index)
{
    WasmFunctionInfo* wasmInfo = m_module->GetWasmFunctionInfo(index);
    if (!wasmInfo)
    {
        throw WasmCompilationException(_u("Invalid function index %u"), index);
    }

    const char16* functionName = nullptr;
    int nameLength = 0;

    if (wasmInfo->GetNameLength() > 0)
    {
        functionName = wasmInfo->GetName();
        nameLength = wasmInfo->GetNameLength();
    }
    else
    {
        for (uint32 iExport = 0; iExport < m_module->GetExportCount(); ++iExport)
        {
            Wasm::WasmExport* wasmExport = m_module->GetExport(iExport);
            if (wasmExport  &&
                wasmExport->kind == ExternalKinds::Function &&
                wasmExport->nameLength > 0 &&
                m_module->GetFunctionIndexType(wasmExport->index) == FunctionIndexTypes::Function &&
                wasmExport->index == wasmInfo->GetNumber())
            {
                nameLength = wasmExport->nameLength + 16;
                char16 * autoName = RecyclerNewArrayLeafZ(m_recycler, char16, nameLength);
                nameLength = swprintf_s(autoName, nameLength, _u("%s[%u]"), wasmExport->name, wasmInfo->GetNumber());
                functionName = autoName;
                break;
            }
        }
    }

    if (!functionName)
    {
        char16* autoName = RecyclerNewArrayLeafZ(m_recycler, char16, 32);
        nameLength = swprintf_s(autoName, 32, _u("wasm-function[%u]"), wasmInfo->GetNumber());
        functionName = autoName;
    }

    Js::FunctionBody* body = Js::FunctionBody::NewFromRecycler(
        m_scriptContext,
        functionName,
        nameLength,
        0,
        0,
        m_sourceInfo,
        m_sourceInfo->GetSrcInfo()->sourceContextInfo->sourceContextId,
        wasmInfo->GetNumber(),
        Js::FunctionInfo::Attributes::ErrorOnNew,
        Js::FunctionBody::Flags_None
#ifdef PERF_COUNTERS
        , false /* is function from deferred deserialized proxy */
#endif
    );
    wasmInfo->SetBody(body);
    // TODO (michhol): numbering
    body->SetSourceInfo(0);
    body->AllocateAsmJsFunctionInfo();
    body->SetIsAsmJsFunction(true);
    body->SetIsAsmjsMode(true);
    body->SetIsWasmFunction(true);

    WasmReaderInfo* readerInfo = RecyclerNew(m_recycler, WasmReaderInfo);
    readerInfo->m_funcInfo = wasmInfo;
    readerInfo->m_module = m_module;

    Js::WasmLibrary::ResetFunctionBodyDefaultEntryPoint(body);

    Js::AsmJsFunctionInfo* info = body->GetAsmJsFunctionInfo();
    info->SetWasmReaderInfo(readerInfo);
    info->SetWebAssemblyModule(m_module);

    Js::ArgSlot paramCount = wasmInfo->GetParamCount();
    info->SetArgCount(paramCount);
    info->SetWasmSignature(wasmInfo->GetSignature());
    Js::ArgSlot argSizeLength = max(paramCount, 3ui16);
    info->SetArgSizeArrayLength(argSizeLength);
    uint32* argSizeArray = RecyclerNewArrayLeafZ(m_recycler, uint32, argSizeLength);
    info->SetArgsSizesArray(argSizeArray);

    if (paramCount > 0)
    {
        // +1 here because asm.js includes the this pointer
        body->SetInParamsCount(paramCount + 1);
        body->SetReportedInParamsCount(paramCount + 1);
        info->SetArgTypeArray(RecyclerNewArrayLeaf(m_recycler, Js::AsmJsVarType::Which, paramCount));
    }
    else
    {
        // overwrite default value in this case
        body->SetHasImplicitArgIns(false);
    }
    for (Js::ArgSlot i = 0; i < paramCount; ++i)
    {
        WasmTypes::WasmType type = wasmInfo->GetSignature()->GetParam(i);
        info->SetArgType(WasmToAsmJs::GetAsmJsVarType(type), i);
        argSizeArray[i] = wasmInfo->GetSignature()->GetParamSize(i);
    }
    info->SetArgByteSize(wasmInfo->GetSignature()->GetParamsSize());
    if (wasmInfo->GetSignature()->GetResultCount() <= 1)
    {
        WasmTypes::WasmType returnType = wasmInfo->GetSignature()->GetResultCount() == 1 ? wasmInfo->GetSignature()->GetResult(0) : WasmTypes::Void;
        info->SetReturnType(WasmToAsmJs::GetAsmJsReturnType(returnType));
    }
    else
    {
        throw WasmCompilationException(_u("Multi return values not supported"));
    }
}